

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O0

void __thiscall MsFlash50::extra::extra(extra *this,uint8_t *p)

{
  uint32_t uVar1;
  string local_38;
  uchar *local_18;
  uint8_t *p_local;
  extra *this_local;
  
  local_18 = p;
  p_local = (uint8_t *)this;
  std::__cxx11::string::string((string *)this);
  getstr<unsigned_char_const*>(&local_38,local_18,8);
  std::__cxx11::string::operator=((string *)this,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  uVar1 = get32le<unsigned_char_const*>(local_18 + 8);
  this->start = uVar1;
  uVar1 = get32le<unsigned_char_const*>(local_18 + 0xc);
  this->size = uVar1;
  return;
}

Assistant:

extra(const uint8_t *p)
        {
            name= getstr(p, 8);

            start= get32le(p+8);
            size= get32le(p+12);
        }